

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

PropertyDescriptor *
Js::JavascriptOperators::FillMissingPropertyDescriptorFields<true>
          (PropertyDescriptor *__return_storage_ptr__,PropertyDescriptor *descriptor,
          ScriptContext *scriptContext)

{
  bool bVar1;
  Var pvVar2;
  PropertyDescriptor *pPVar3;
  PropertyDescriptor *this;
  
  PropertyDescriptor::PropertyDescriptor(__return_storage_ptr__);
  this = &((scriptContext->super_ScriptContextBase).javascriptLibrary)->defaultPropertyDescriptor;
  pPVar3 = this;
  if (descriptor->getterSpecified != false) {
    pPVar3 = descriptor;
  }
  pvVar2 = PropertyDescriptor::GetGetter(pPVar3);
  PropertyDescriptor::SetGetter(__return_storage_ptr__,pvVar2);
  pPVar3 = this;
  if (descriptor->setterSpecified != false) {
    pPVar3 = descriptor;
  }
  pvVar2 = PropertyDescriptor::GetSetter(pPVar3);
  PropertyDescriptor::SetSetter(__return_storage_ptr__,pvVar2);
  pPVar3 = this;
  if (descriptor->configurableSpecified != false) {
    pPVar3 = descriptor;
  }
  bVar1 = PropertyDescriptor::IsConfigurable(pPVar3);
  PropertyDescriptor::SetConfigurable(__return_storage_ptr__,bVar1);
  if (descriptor->enumerableSpecified != false) {
    this = descriptor;
  }
  bVar1 = PropertyDescriptor::IsEnumerable(this);
  PropertyDescriptor::SetEnumerable(__return_storage_ptr__,bVar1);
  return __return_storage_ptr__;
}

Assistant:

PropertyDescriptor JavascriptOperators::FillMissingPropertyDescriptorFields(PropertyDescriptor descriptor, ScriptContext* scriptContext)
    {
        PropertyDescriptor newDescriptor;
        const PropertyDescriptor* defaultDescriptor = scriptContext->GetLibrary()->GetDefaultPropertyDescriptor();
        if (isAccessor)
        {
            newDescriptor.SetGetter(descriptor.GetterSpecified() ? descriptor.GetGetter() : defaultDescriptor->GetGetter());
            newDescriptor.SetSetter(descriptor.SetterSpecified() ? descriptor.GetSetter() : defaultDescriptor->GetSetter());
        }
        else
        {
            newDescriptor.SetValue(descriptor.ValueSpecified() ? descriptor.GetValue() : defaultDescriptor->GetValue());
            newDescriptor.SetWritable(descriptor.WritableSpecified() ? descriptor.IsWritable() : defaultDescriptor->IsWritable());
        }
        newDescriptor.SetConfigurable(descriptor.ConfigurableSpecified() ? descriptor.IsConfigurable() : defaultDescriptor->IsConfigurable());
        newDescriptor.SetEnumerable(descriptor.EnumerableSpecified() ? descriptor.IsEnumerable() : defaultDescriptor->IsEnumerable());
        return newDescriptor;
    }